

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-virt.c
# Opt level: O1

void * mem_realloc(void *p,size_t len)

{
  void *pvVar1;
  
  if (len == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = realloc(p,len);
    if (pvVar1 == (void *)0x0) {
      quit("Out of Memory!");
    }
  }
  return pvVar1;
}

Assistant:

void *mem_realloc(void *p, size_t len)
{
	/* Note: standard realloc(3) frees if passed a size of 0, so this
	 * wrapper has different behavior. */
	if (!len)
		return NULL;

	p = realloc(p, len);
	if (!p)
		quit("Out of Memory!");
	return p;
}